

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O1

String * __thiscall
Jinx::Impl::FoldCase_abi_cxx11_(String *__return_storage_ptr__,Impl *this,char *curr,char *end)

{
  bool bVar1;
  size_t charsOut;
  char32_t cp2;
  char32_t cp1;
  char32_t codepoint;
  char buffer2 [5];
  char buffer [5];
  size_t charsOut2;
  size_t local_68;
  char32_t local_5c;
  char32_t local_58;
  char32_t local_54;
  char local_50 [8];
  char local_48 [8];
  size_t local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *local_38;
  
  bVar1 = IsCaseFolded((char *)this,curr);
  if (!bVar1) {
    local_38 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
              (__return_storage_ptr__,(long)curr - (long)this);
    if (this < curr) {
      do {
        if ((long)(char)*this < 0) {
          local_54 = L'\0';
          local_68 = 0;
          ConvertUtf8ToUtf32((char *)this,(long)curr - (long)this,&local_54,&local_68);
          local_58 = L'\0';
          local_5c = L'\0';
          bVar1 = FindCaseFoldingData(local_54,&local_58,&local_5c);
          if (bVar1) {
            local_48[4] = 0;
            local_48[0] = '\0';
            local_48[1] = '\0';
            local_48[2] = '\0';
            local_48[3] = '\0';
            ConvertUtf32ToUtf8(local_58,local_48,5,&local_68);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                      (__return_storage_ptr__,local_48);
            if (local_5c != L'\0') {
              local_40 = 0;
              local_50[4] = 0;
              local_50[0] = '\0';
              local_50[1] = '\0';
              local_50[2] = '\0';
              local_50[3] = '\0';
              ConvertUtf32ToUtf8(local_5c,local_50,5,&local_40);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              append(__return_storage_ptr__,local_48);
              local_68 = local_68 + local_40;
            }
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                      (__return_storage_ptr__,(char *)this,local_68);
          }
          this = this + local_68;
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          push_back(__return_storage_ptr__,(char)UnicodeData::fastFold[(char)*this]);
          this = this + 1;
        }
      } while (this < curr);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!IsCaseFolded(curr, end)",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxUnicode.cpp"
                ,0x187,"String Jinx::Impl::FoldCase(const char *, const char *)");
}

Assistant:

inline_t String FoldCase(const char * curr, const char * end)
	{
		assert(!IsCaseFolded(curr, end));

		String s;
		s.reserve(end - curr);
		while (curr < end)
		{
			// Attempt simple (ASCII-only) folding if possible first
			unsigned char c = *curr;
			if (!((c & 0x80) == 0x80))
			{
				s.push_back(static_cast<unsigned char>(Impl::UnicodeData::fastFold[c]));
				++curr;
			}
			// Non-ASCII codepoints require lookups via the global folding map
			else
			{
				char32_t codepoint = 0;
				size_t charsOut = 0;
				Impl::ConvertUtf8ToUtf32(curr, end - curr, &codepoint, &charsOut);

				char32_t cp1 = 0;
				char32_t cp2 = 0;
				if (FindCaseFoldingData(codepoint, &cp1, &cp2))
				{
					char buffer[5] = { 0, 0, 0, 0, 0 };
					Impl::ConvertUtf32ToUtf8(cp1, buffer, std::size(buffer), &charsOut);
					s.append(buffer);
					if (cp2)
					{
						size_t charsOut2 = 0;
						char buffer2[5] = { 0, 0, 0, 0, 0 };
						Impl::ConvertUtf32ToUtf8(cp2, buffer2, std::size(buffer2), &charsOut2);
						s.append(buffer);
						charsOut += charsOut2;
					}
				}
				else
				{
					s.append(curr, charsOut);
				}
				curr += charsOut;
			}
		}

		return s;
	}